

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxCompareEq::EmitCompare
          (FxCompareEq *this,VMFunctionBuilder *build,bool invert,
          TArray<unsigned_long,_unsigned_long> *patchspots_yes,
          TArray<unsigned_long,_unsigned_long> *patchspots_no)

{
  ExpEmit this_00;
  size_t local_40;
  ExpEmit local_38;
  ExpEmit emit;
  TArray<unsigned_long,_unsigned_long> *patchspots_no_local;
  TArray<unsigned_long,_unsigned_long> *patchspots_yes_local;
  bool invert_local;
  VMFunctionBuilder *build_local;
  FxCompareEq *this_local;
  
  emit = (ExpEmit)patchspots_no;
  local_38 = EmitCommon(this,build,true,invert);
  ExpEmit::Free(&local_38,build);
  this_00 = emit;
  local_40 = VMFunctionBuilder::Emit(build,0x44,0);
  TArray<unsigned_long,_unsigned_long>::Push
            ((TArray<unsigned_long,_unsigned_long> *)this_00,&local_40);
  return;
}

Assistant:

void FxCompareEq::EmitCompare(VMFunctionBuilder *build, bool invert, TArray<size_t> &patchspots_yes, TArray<size_t> &patchspots_no)
{
	ExpEmit emit = EmitCommon(build, true, invert);
	emit.Free(build);
	patchspots_no.Push(build->Emit(OP_JMP, 0));
}